

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O2

int errorlist_add_va(ErrorList *list,char *_fname,int errpos,char *fmt,__va_list_tag *va)

{
  MOJOSHADER_malloc p_Var1;
  uint uVar2;
  ErrorItem *pEVar3;
  size_t sVar4;
  char *__s;
  void *pvVar5;
  ErrorItem *local_e8;
  va_list ap;
  char scratch [128];
  
  pEVar3 = (ErrorItem *)(*list->m)(0x20,list->d);
  if (pEVar3 == (ErrorItem *)0x0) {
    return 0;
  }
  if (_fname == (char *)0x0) {
    local_e8 = (ErrorItem *)0x0;
  }
  else {
    p_Var1 = list->m;
    sVar4 = strlen(_fname);
    local_e8 = (ErrorItem *)(*p_Var1)((int)sVar4 + 1,list->d);
    if (local_e8 == (ErrorItem *)0x0) {
      pvVar5 = list->d;
      goto LAB_0011b85b;
    }
    strcpy((char *)local_e8,_fname);
  }
  ap[0].reg_save_area = va->reg_save_area;
  ap[0].gp_offset = va->gp_offset;
  ap[0].fp_offset = va->fp_offset;
  ap[0].overflow_arg_area = va->overflow_arg_area;
  uVar2 = vsnprintf(scratch,0x80,fmt,ap);
  __s = (char *)(*list->m)(uVar2 + 1,list->d);
  if (__s != (char *)0x0) {
    if (uVar2 < 0x80) {
      strcpy(__s,scratch);
    }
    else {
      ap[0].reg_save_area = va->reg_save_area;
      ap[0].gp_offset = va->gp_offset;
      ap[0].fp_offset = va->fp_offset;
      ap[0].overflow_arg_area = va->overflow_arg_area;
      vsnprintf(__s,(long)(int)(uVar2 + 1),fmt,ap);
    }
    (pEVar3->error).error = __s;
    (pEVar3->error).filename = (char *)local_e8;
    (pEVar3->error).error_position = errpos;
    pEVar3->next = (ErrorItem *)0x0;
    list->tail->next = pEVar3;
    list->tail = pEVar3;
    list->count = list->count + 1;
    return 1;
  }
  (*list->f)(pEVar3,list->d);
  pvVar5 = list->d;
  pEVar3 = local_e8;
LAB_0011b85b:
  (*list->f)(pEVar3,pvVar5);
  return 0;
}

Assistant:

int errorlist_add_va(ErrorList *list, const char *_fname,
                     const int errpos, const char *fmt, va_list va)
{
    ErrorItem *error = (ErrorItem *) list->m(sizeof (ErrorItem), list->d);
    if (error == NULL)
        return 0;

    char *fname = NULL;
    if (_fname != NULL)
    {
        fname = (char *) list->m(strlen(_fname) + 1, list->d);
        if (fname == NULL)
        {
            list->f(error, list->d);
            return 0;
        } // if
        strcpy(fname, _fname);
    } // if

    char scratch[128];
    va_list ap;
    va_copy(ap, va);
    int len = vsnprintf(scratch, sizeof (scratch), fmt, ap);
    va_end(ap);

    // on some versions of the windows C runtime, vsnprintf() returns -1
    // if the buffer overflows instead of the length the string would have
    // been as expected.
    // In this case we make another copy of va and fetch the length only
    // with another call to _vscprintf

#ifdef _MSC_VER
    if (len == -1)
    {
        va_copy(ap, va);
        len = _vscprintf(fmt, ap);
        va_end(ap);
    }
#endif

    char *failstr = (char *) list->m(len + 1, list->d);
    if (failstr == NULL)
    {
        list->f(error, list->d);
        list->f(fname, list->d);
        return 0;
    } // if

    // If we overflowed our scratch buffer, that's okay. We were going to
    //  allocate anyhow...the scratch buffer just lets us avoid a second
    //  run of vsnprintf().
    if (len < sizeof (scratch))
        strcpy(failstr, scratch);  // copy it over.
    else
    {
        va_copy(ap, va);
        vsnprintf(failstr, len + 1, fmt, ap);  // rebuild it.
        va_end(ap);
    } // else

    error->error.error = failstr;
    error->error.filename = fname;
    error->error.error_position = errpos;
    error->next = NULL;

    list->tail->next = error;
    list->tail = error;

    list->count++;
    return 1;
}